

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

bool __thiscall ON_Buffer::Seek(ON_Buffer *this,ON__INT64 offset,int origin)

{
  ulong uVar1;
  char *sFormat;
  int line_number;
  ulong uVar2;
  
  if (origin == 0) {
    uVar1 = 0;
  }
  else if (origin == 2) {
    uVar1 = this->m_buffer_size;
  }
  else {
    if (origin != 1) {
      sFormat = "Invalid origin parameter";
      line_number = 0x20a;
      goto LAB_0045fafd;
    }
    uVar1 = this->m_current_position;
  }
  if (offset < 0) {
    if ((ulong)-offset <= uVar1) {
      uVar2 = uVar1 + offset;
      goto LAB_0045fb09;
    }
    sFormat = "Attempt to seek before start of buffer.";
    line_number = 0x215;
  }
  else {
    uVar2 = uVar1;
    if ((offset == 0) || (uVar2 = offset + uVar1, uVar1 < uVar2)) {
LAB_0045fb09:
      if (uVar2 == this->m_current_position) {
        return true;
      }
      this->m_current_position = uVar2;
      this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
      return true;
    }
    sFormat = "Attempt to seek to a position that is too large for 64-bit unsigned int storage.";
    line_number = 0x221;
  }
LAB_0045fafd:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_Buffer::Seek( ON__INT64 offset, int origin )
{
  ON__UINT64 pos0, pos1;

  switch(origin)
  {
  case 0: // Seek from beginning of start.
    pos0 = 0;
    break;

  case 1: // Seek from current position.
    pos0 = m_current_position;
    break;

  case 2: // Seek from end.
    pos0 = m_buffer_size;
    break;

  default:
    {
      ON_ERROR("Invalid origin parameter");
      return false;
    }
    break;
  }

  if ( offset < 0 )
  {
    if ( pos0 < (ON__UINT64)(-offset) )
    {
      // current position cannot be negative
      ON_ERROR("Attempt to seek before start of buffer.");
      return false; 
    }    
    pos1 = pos0 - (ON__UINT64)(-offset); // overflow cannot happen in this operation
  }
  else if ( offset > 0 )
  {
    // current position can be >= m_buffer_size
    pos1 = pos0 + (ON__UINT64)(offset); // overflow is possible in this operation
    if ( pos1 <= pos0 )
    {
      // overflow
      ON_ERROR("Attempt to seek to a position that is too large for 64-bit unsigned int storage.");
      return false; 
    }
  }
  else
  {
    pos1 = pos0;
  }

  if ( pos1 != m_current_position )
  {
    m_current_position = pos1;
    m_current_segment = 0;
  }

  return true;
}